

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

string * deqp::gles31::Functional::anon_unknown_1::UserDefinedIOCase::glslCheckBasicTypeObject
                   (string *__return_storage_ptr__,string *name,DataType type,int indentationDepth)

{
  char *pcVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  byte local_1ab;
  allocator<char> local_1aa;
  byte local_1a9;
  string local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  int local_164;
  undefined1 local_160 [4];
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_5d;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string indentation;
  int scalarSize;
  int indentationDepth_local;
  DataType type_local;
  string *name_local;
  string *result;
  
  indentation.field_2._12_4_ = glu::getDataTypeScalarSize(type);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,(long)indentationDepth,'\t',&local_49);
  std::allocator<char>::~allocator(&local_49);
  local_5d = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::operator+(&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 "allOk = allOk && compare_");
  pcVar1 = glu::getDataTypeName(type);
  std::operator+(&local_e0,&local_100,pcVar1);
  std::operator+(&local_c0,&local_e0,"(");
  std::operator+(&local_a0,&local_c0,name);
  std::operator+(&local_80,&local_a0,", ");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  uVar2 = extraout_RDX;
  if (type != TYPE_FLOAT) {
    std::__cxx11::string::string((string *)local_160);
    pcVar1 = glu::getDataTypeName(type);
    std::operator+(&local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160,
                   pcVar1);
    std::operator+(&local_120,&local_140,"(");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)local_160);
    uVar2 = extraout_RDX_00;
  }
  for (local_164 = 0; local_164 < (int)indentation.field_2._12_4_; local_164 = local_164 + 1) {
    local_1a9 = 0;
    local_1ab = 0;
    if (local_164 < 1) {
      std::allocator<char>::allocator();
      local_1ab = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"v",&local_1aa);
    }
    else {
      de::floatToString_abi_cxx11_(&local_1a8,(de *)&DAT_00000001,(float)local_164 * 0.8,(int)uVar2)
      ;
      local_1a9 = 1;
      std::operator+(&local_188,", v+",&local_1a8);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    uVar2 = extraout_RDX_01;
    if ((local_1ab & 1) != 0) {
      std::allocator<char>::~allocator(&local_1aa);
      uVar2 = extraout_RDX_02;
    }
    if ((local_1a9 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1a8);
      uVar2 = extraout_RDX_03;
    }
  }
  if (type != TYPE_FLOAT) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
  }
  std::operator+(&local_230,");\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  std::operator+(&local_210,&local_230,"v += 0.4;\n");
  std::operator+(&local_1f0,&local_210,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
  std::operator+(&local_1d0,&local_1f0,"if (allOk) firstFailedInputIndex++;\n");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  local_5d = 1;
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

string UserDefinedIOCase::glslCheckBasicTypeObject (const string& name, glu::DataType type, int indentationDepth)
{
	const int		scalarSize		= glu::getDataTypeScalarSize(type);
	const string	indentation		= string(indentationDepth, '\t');
	string			result;

	result += indentation + "allOk = allOk && compare_" + glu::getDataTypeName(type) + "(" + name + ", ";

	if (type != glu::TYPE_FLOAT)
		result += string() + glu::getDataTypeName(type) + "(";
	for (int i = 0; i < scalarSize; i++)
		result += (i > 0 ? ", v+" + de::floatToString(0.8f*(float)i, 1)
						 : "v");
	if (type != glu::TYPE_FLOAT)
		result += ")";
	result += ");\n" +
			  indentation + "v += 0.4;\n" +
			  indentation + "if (allOk) firstFailedInputIndex++;\n";

	return result;
}